

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O2

void __thiscall efsw::FileWatcherGeneric::removeWatch(FileWatcherGeneric *this,WatchID watchid)

{
  WatchList *this_00;
  _List_node_base *p_Var1;
  const_iterator __position;
  
  this_00 = &this->mWatches;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) {
      return;
    }
    p_Var1 = __position._M_node[1]._M_next;
  } while (p_Var1->_M_prev != (_List_node_base *)watchid);
  Mutex::lock(&this->mWatchesLock);
  std::__cxx11::list<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::erase
            (this_00,__position);
  (*(code *)p_Var1->_M_next->_M_prev)(p_Var1);
  Mutex::unlock(&this->mWatchesLock);
  return;
}

Assistant:

void FileWatcherGeneric::removeWatch(WatchID watchid)
{
	WatchList::iterator it = mWatches.begin();

	for ( ; it != mWatches.end(); it++ )
	{
		if ( (*it)->ID == watchid )
		{
			WatcherGeneric * watch = (*it);

			mWatchesLock.lock();

			mWatches.erase( it );

			efSAFE_DELETE( watch ) ;

			mWatchesLock.unlock();

			return;
		}
	}
}